

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

ValueHolder *
testing::internal::
CheckedDowncastToActualType<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
          (ThreadLocalValueHolderBase *base)

{
  bool bVar1;
  ostream *poVar2;
  long in_FS_OFFSET;
  ValueHolder *local_50;
  ThreadLocalValueHolderBase *base_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (base == (ThreadLocalValueHolderBase *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) goto LAB_001d1d64;
    __cxa_bad_typeid();
  }
  bVar1 = std::type_info::operator==
                    ((type_info *)base->_vptr_ThreadLocalValueHolderBase[-1],
                     (type_info *)
                     &ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder::typeinfo)
  ;
  bVar1 = IsTrue(bVar1);
  if (!bVar1) {
    GTestLog::GTestLog((GTestLog *)((long)&base_local + 4),GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x5f7);
    poVar2 = GTestLog::GetStream((GTestLog *)((long)&base_local + 4));
    std::operator<<(poVar2,"Condition typeid(*base) == typeid(Derived) failed. ");
    GTestLog::~GTestLog((GTestLog *)((long)&base_local + 4));
  }
  if (base == (ThreadLocalValueHolderBase *)0x0) {
    local_50 = (ValueHolder *)0x0;
  }
  else {
    local_50 = (ValueHolder *)
               __dynamic_cast(base,&ThreadLocalValueHolderBase::typeinfo,
                              &ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder::
                               typeinfo,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return local_50;
  }
LAB_001d1d64:
  __stack_chk_fail();
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}